

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

char __thiscall
Fl_Preferences::get(Fl_Preferences *this,char *key,void *data,void *defaultValue,int defaultSize,
                   int maxSize)

{
  char cVar1;
  undefined8 in_RAX;
  char *src;
  void *__src;
  int dsize;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  src = Node::get(this->node,key);
  if (src == (char *)0x0) {
    if (defaultValue != (void *)0x0) {
      if (defaultSize < maxSize) {
        maxSize = defaultSize;
      }
      memmove(data,defaultValue,(long)maxSize);
    }
    cVar1 = '\0';
  }
  else {
    __src = decodeHex(src,&local_24);
    if (local_24 < maxSize) {
      maxSize = local_24;
    }
    memcpy(data,__src,(long)maxSize);
    free(__src);
    cVar1 = '\x01';
  }
  return cVar1;
}

Assistant:

char Fl_Preferences::get( const char *key, void *data, const void *defaultValue, int defaultSize, int maxSize ) {
  const char *v = node->get( key );
  if ( v ) {
    int dsize;
    void *w = decodeHex( v, dsize );
    memmove( data, w, dsize>maxSize?maxSize:dsize );
    free( w );
    return 1;
  }
  if ( defaultValue )
    memmove( data, defaultValue, defaultSize>maxSize?maxSize:defaultSize );
  return 0;
}